

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

void slang::ast::ConversionExpression::checkImplicitConversions
               (ASTContext *context,Type *sourceType,Type *targetType,Expression *op,
               Expression *parentExpr,SourceRange operatorRange,ConversionKind conversionKind)

{
  bool bVar1;
  __optional_lt_t<unsigned_int,_unsigned_int> _Var2;
  uint uVar3;
  EffectiveSign EVar4;
  bitwidth_t bVar5;
  bitwidth_t bVar6;
  Type *pTVar7;
  Type *t;
  BinaryExpression *this;
  InstanceSymbolBase *pIVar8;
  ASTContext *in_RDI;
  Expression *in_R8;
  int in_R9D;
  DiagCode code_1;
  DiagCode code;
  optional<unsigned_int> effective;
  bitwidth_t actualWidth;
  bitwidth_t targetWidth;
  anon_class_1_0_00000001 isZeroOrUnsized;
  Type *rt;
  Type *lt;
  anon_class_8_1_3fcf669f isCompoundAssign;
  anon_class_24_3_d0f3c930 addDiag;
  anon_class_8_1_8edc1b7d parentIsComparison;
  anon_class_1_0_00000001 isMultiDimArray;
  anon_class_1_0_00000001 isStructUnionEnum;
  Expression *in_stack_00000270;
  ASTContext *in_stack_00000278;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  Type *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  Diagnostic *in_stack_fffffffffffffee0;
  DiagCode *local_118;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Type *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  DiagCode in_stack_ffffffffffffff0c;
  DiagCode DVar9;
  SymbolKind in_stack_ffffffffffffff10;
  DiagCode in_stack_ffffffffffffff14;
  Type *in_stack_ffffffffffffff18;
  Diagnostic *in_stack_ffffffffffffff20;
  SourceLocation in_stack_ffffffffffffff28;
  DiagCode local_c4;
  _Optional_payload_base<unsigned_int> local_c0;
  bitwidth_t local_b8;
  bitwidth_t local_b4;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Type *in_stack_ffffffffffffff58;
  Type *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8e;
  anon_class_1_0_00000001 local_2d;
  int local_2c;
  Expression *local_28;
  ASTContext *local_8;
  
  local_2d = (anon_class_1_0_00000001)0x0;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_8 = in_RDI;
  bVar1 = checkImplicitConversions::anon_class_8_1_3fcf669f::operator()
                    ((anon_class_8_1_3fcf669f *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (bVar1) {
    return;
  }
  pTVar7 = Type::getCanonicalType(in_stack_fffffffffffffed0);
  t = Type::getCanonicalType(in_stack_fffffffffffffed0);
  bVar1 = Type::isIntegral(in_stack_fffffffffffffed0);
  if ((!bVar1) || (bVar1 = Type::isIntegral(in_stack_fffffffffffffed0), !bVar1)) {
    bVar1 = Type::isNumeric(in_stack_fffffffffffffed0);
    if (!bVar1) {
      return;
    }
    bVar1 = Type::isNumeric(in_stack_fffffffffffffed0);
    if (!bVar1) {
      return;
    }
    pTVar7 = (Type *)&stack0xffffffffffffff10;
    ASTContext::tryEval(in_stack_00000278,in_stack_00000270);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb87696);
    uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xb876a6);
    if ((uVar3 & 0x1000000) != 0) {
      return;
    }
    DiagCode::DiagCode((DiagCode *)&stack0xffffffffffffff0c);
    bVar1 = Type::isIntegral(pTVar7);
    if (bVar1) {
      DVar9.subsystem = Expressions;
      DVar9.code = 0xbf;
    }
    else {
      bVar1 = Type::isIntegral(pTVar7);
      if (bVar1) {
        DVar9.subsystem = Expressions;
        DVar9.code = 199;
      }
      else {
        bVar5 = Type::getBitWidth((Type *)CONCAT44(uVar3,in_stack_fffffffffffffed8));
        bVar6 = Type::getBitWidth((Type *)CONCAT44(uVar3,in_stack_fffffffffffffed8));
        if (bVar5 < bVar6) {
          DVar9.subsystem = Expressions;
          DVar9.code = 0xc0;
        }
        else {
          bVar5 = Type::getBitWidth((Type *)CONCAT44(uVar3,in_stack_fffffffffffffed8));
          bVar6 = Type::getBitWidth((Type *)CONCAT44(uVar3,in_stack_fffffffffffffed8));
          if (bVar5 <= bVar6) {
            return;
          }
          DVar9.subsystem = Expressions;
          DVar9.code = 0xc1;
        }
      }
    }
    checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
              ((anon_class_24_3_d0f3c930 *)CONCAT44(DVar9,DVar9),in_stack_ffffffffffffff14);
    ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    return;
  }
  bVar1 = checkImplicitConversions::anon_class_1_0_00000001::operator()(&local_2d,pTVar7);
  if (((bVar1) &&
      (bVar1 = checkImplicitConversions::anon_class_1_0_00000001::operator()(&local_2d,t), bVar1))
     && (bVar1 = Type::isMatching((Type *)CONCAT26(in_stack_ffffffffffffff8e,
                                                   in_stack_ffffffffffffff88),
                                  in_stack_ffffffffffffff80), !bVar1)) {
    bVar1 = anon_unknown.dwarf_199b981::isSameStructUnion
                      (in_stack_ffffffffffffff58,
                       (Type *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (bVar1) {
      return;
    }
    bVar1 = anon_unknown.dwarf_199b981::isUnionMemberType
                      (in_stack_ffffffffffffff18,
                       (Type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (bVar1) {
      return;
    }
    checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
              ((anon_class_24_3_d0f3c930 *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff14);
    ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    return;
  }
  bVar1 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)in_stack_fffffffffffffed0,
                     (Type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (((bVar1) &&
      (bVar1 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)in_stack_fffffffffffffed0,
                          (Type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
      bVar1)) &&
     ((bVar1 = anon_unknown.dwarf_199b981::hasSameDims
                         (in_stack_fffffffffffffef8,
                          (Type *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
      !bVar1 && (bVar1 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff28,
                                    (Expression *)in_stack_ffffffffffffff20), !bVar1)))) {
    bVar1 = checkImplicitConversions::anon_class_8_1_8edc1b7d::operator()
                      ((anon_class_8_1_8edc1b7d *)in_stack_fffffffffffffed0);
    if (bVar1) {
      this = Expression::as<slang::ast::BinaryExpression>(local_28);
      BinaryExpression::right(this);
      bVar1 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff28,
                         (Expression *)in_stack_ffffffffffffff20);
      if (bVar1) goto LAB_00b873ba;
    }
    checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
              ((anon_class_24_3_d0f3c930 *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff14);
    ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
LAB_00b873ba:
  ASTContext::tryEval(in_stack_00000278,in_stack_00000270);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb873e6);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xb873f9);
  if (!bVar1) {
    bVar1 = Type::isSigned(in_stack_fffffffffffffed0);
    uVar3 = (uint)bVar1;
    bVar1 = Type::isSigned(in_stack_fffffffffffffed0);
    if (((uVar3 != bVar1) &&
        (bVar1 = checkImplicitConversions::anon_class_8_1_8edc1b7d::operator()
                           ((anon_class_8_1_8edc1b7d *)in_stack_fffffffffffffed0), !bVar1)) &&
       (EVar4 = Expression::getEffectiveSign
                          ((Expression *)in_stack_fffffffffffffed0,
                           SUB41((uint)in_stack_fffffffffffffecc >> 0x18,0)), EVar4 != Either)) {
      checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                ((anon_class_24_3_d0f3c930 *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff14);
      ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      ast::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    if (local_2c != 1) {
      local_b4 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffedc,
                                                    in_stack_fffffffffffffed8));
      local_b8 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffedc,
                                                    in_stack_fffffffffffffed8));
      if (local_b4 != local_b8) {
        local_c0 = (_Optional_payload_base<unsigned_int>)
                   Expression::getEffectiveWidth
                             ((Expression *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0xb87531);
        if ((bVar1) &&
           ((_Var2 = std::enable_if<is_convertible<decltype(((std::
                     declval<unsigned_int_const&>)())<((std::declval<unsigned_int_const&>)())),bool>
                     ::value,bool>::type_std::operator<
                               ((uint *)in_stack_fffffffffffffed0,
                                (optional<unsigned_int> *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
            _Var2 || (local_b8 < local_b4)))) {
          DiagCode::DiagCode(&local_c4);
          pIVar8 = ASTContext::getInstance(local_8);
          if (pIVar8 == (InstanceSymbolBase *)0x0) {
            _Var2 = std::enable_if<is_convertible<decltype(((std::
                    declval<unsigned_int_const&>)())<((std::declval<unsigned_int_const&>)())),bool>
                    ::value,bool>::type_std::operator<
                              ((uint *)in_stack_fffffffffffffed0,
                               (optional<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            if (_Var2) {
              in_stack_fffffffffffffee0 = (Diagnostic *)&slang::diag::WidthTruncate;
            }
            else {
              in_stack_fffffffffffffee0 = (Diagnostic *)&slang::diag::WidthExpand;
            }
            local_c4 = *(DiagCode *)
                        &(in_stack_fffffffffffffee0->args).
                         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            _Var2 = std::enable_if<is_convertible<decltype(((std::
                    declval<unsigned_int_const&>)())<((std::declval<unsigned_int_const&>)())),bool>
                    ::value,bool>::type_std::operator<
                              ((uint *)in_stack_fffffffffffffed0,
                               (optional<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            if (_Var2) {
              local_118 = (DiagCode *)&slang::diag::PortWidthTruncate;
            }
            else {
              local_118 = (DiagCode *)&slang::diag::PortWidthExpand;
            }
            local_c4 = *local_118;
          }
          checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                    ((anon_class_24_3_d0f3c930 *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff14);
          Diagnostic::operator<<<unsigned_int>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          Diagnostic::operator<<<unsigned_int>(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        }
      }
    }
  }
  return;
}

Assistant:

void ConversionExpression::checkImplicitConversions(
    const ASTContext& context, const Type& sourceType, const Type& targetType, const Expression& op,
    const Expression* parentExpr, SourceRange operatorRange, ConversionKind conversionKind) {

    auto isStructUnionEnum = [](const Type& t) {
        return t.kind == SymbolKind::PackedStructType || t.kind == SymbolKind::PackedUnionType ||
               t.kind == SymbolKind::EnumType;
    };

    auto isMultiDimArray = [](const Type& t) {
        return t.kind == SymbolKind::PackedArrayType && t.getArrayElementType()->getBitWidth() > 1;
    };

    auto parentIsComparison = [&] {
        return parentExpr && parentExpr->kind == ExpressionKind::BinaryOp &&
               OpInfo::isComparison(parentExpr->as<BinaryExpression>().op);
    };

    auto addDiag = [&](DiagCode code) -> Diagnostic& {
        auto& diag = context.addDiag(code, op.sourceRange);
        if (operatorRange.start())
            diag << operatorRange;
        return diag;
    };

    // Don't warn about conversions in compound assignment operators.
    auto isCompoundAssign = [&] {
        auto& expr = op.unwrapImplicitConversions();
        if (expr.kind == ExpressionKind::LValueReference)
            return true;

        return expr.kind == ExpressionKind::BinaryOp &&
               expr.as<BinaryExpression>().left().unwrapImplicitConversions().kind ==
                   ExpressionKind::LValueReference;
    };
    if (isCompoundAssign())
        return;

    const Type& lt = targetType.getCanonicalType();
    const Type& rt = sourceType.getCanonicalType();
    if (lt.isIntegral() && rt.isIntegral()) {
        // Warn for conversions between different enums/structs/unions.
        if (isStructUnionEnum(lt) && isStructUnionEnum(rt) && !lt.isMatching(rt)) {
            if (!isSameStructUnion(lt, rt) && !isUnionMemberType(lt, rt))
                addDiag(diag::ImplicitConvert) << sourceType << targetType;
            return;
        }

        // Warn for conversions between packed arrays of differing
        // dimension counts or sizes.
        if (isMultiDimArray(lt) && isMultiDimArray(rt) && !hasSameDims(lt, rt)) {
            // Avoid warning for assignments or comparisons with 0 or '0, '1.
            auto isZeroOrUnsized = [](const Expression& e) {
                auto expr = &e.unwrapImplicitConversions();
                if (expr->kind == ExpressionKind::ConditionalOp) {
                    if (auto known = expr->as<ConditionalExpression>().knownSide())
                        expr = known;
                }

                return expr->kind == ExpressionKind::UnbasedUnsizedIntegerLiteral ||
                       (expr->kind == ExpressionKind::IntegerLiteral &&
                        bool(expr->as<IntegerLiteral>().getValue() == 0));
            };

            if (!isZeroOrUnsized(op) &&
                (!parentIsComparison() ||
                 !isZeroOrUnsized(parentExpr->as<BinaryExpression>().right()))) {
                addDiag(diag::PackedArrayConv) << sourceType << targetType;
            }
        }

        // Check to rule out false positives: try to eval as a constant.
        // We'll ignore any constants, because they will get their own more
        // fine grained warning during eval.
        if (context.tryEval(op))
            return;

        // Warn for sign conversions.
        if (lt.isSigned() != rt.isSigned()) {
            // Comparisons get their own warning elsewhere.
            if (!parentIsComparison() && op.getEffectiveSign(/* isForConversion */ false) !=
                                             Expression::EffectiveSign::Either) {
                addDiag(diag::SignConversion) << sourceType << targetType;
            }
        }

        // Don't issue width warnings for propagated conversions, as they would
        // be extremely noisy and of dubious value (since they act the way people
        // expect their expressions to behave).
        if (conversionKind == ConversionKind::Propagated)
            return;

        // Warn for implicit assignments between integral types of differing widths.
        bitwidth_t targetWidth = lt.getBitWidth();
        bitwidth_t actualWidth = rt.getBitWidth();
        if (targetWidth == actualWidth)
            return;

        // Before we go and issue this warning, weed out false positives by
        // recomputing the width of the expression, with all constants sized
        // to the minimum width necessary to represent them. Otherwise, even
        // code as simple as this will result in a warning:
        //    logic [3:0] a = 1;
        std::optional<bitwidth_t> effective = op.getEffectiveWidth();
        if (!effective)
            return;

        // Now that we know the effective width, compare it to the expression's
        // actual width. We don't warn if the target is anywhere in between the
        // effective and the actual width.
        SLANG_ASSERT(effective <= actualWidth);
        if (targetWidth < effective || targetWidth > actualWidth) {
            DiagCode code;
            if (context.getInstance())
                code = targetWidth < effective ? diag::PortWidthTruncate : diag::PortWidthExpand;
            else
                code = targetWidth < effective ? diag::WidthTruncate : diag::WidthExpand;
            addDiag(code) << actualWidth << targetWidth;
        }
    }
    else if (lt.isNumeric() && rt.isNumeric()) {
        // Don't warn for constexprs.
        if (context.tryEval(op))
            return;

        DiagCode code;
        if (lt.isIntegral())
            code = diag::FloatIntConv;
        else if (rt.isIntegral())
            code = diag::IntFloatConv;
        else if (lt.getBitWidth() < rt.getBitWidth())
            code = diag::FloatNarrow;
        else if (lt.getBitWidth() > rt.getBitWidth())
            code = diag::FloatWiden;
        else
            return;

        addDiag(code) << sourceType << targetType;
    }
}